

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literal * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::doAtomicLoad
          (Literal *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Address addr,
          Index bytes,Type type,Name memoryName,Address memorySize)

{
  address64_t aVar1;
  undefined1 local_e8 [8];
  Load load;
  Literal local_88;
  undefined1 local_70 [8];
  Const ptr;
  undefined1 local_34;
  Index bytes_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  Address memorySize_local;
  Type type_local;
  Address addr_local;
  
  ptr.value.type.id = memorySize.addr;
  type_local.id = addr.addr;
  checkAtomicAddress(this,addr,bytes,memorySize);
  Const::Const((Const *)local_70);
  aVar1 = wasm::Address::operator_cast_to_unsigned_long((Address *)&type_local);
  wasm::Literal::Literal(&local_88,(int32_t)aVar1);
  wasm::Literal::operator=
            ((Literal *)
             &ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type,&local_88
            );
  wasm::Literal::~Literal(&local_88);
  wasm::Type::Type((Type *)&load.memory.super_IString.str._M_str,i32);
  ptr.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._0_8_ =
       load.memory.super_IString.str._M_str;
  Load::Load((Load *)local_e8);
  local_34 = (undefined1)bytes;
  load.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id._0_1_ = local_34;
  load.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id._1_1_ = 0;
  wasm::Address::operator=(&load.offset,(ulong)bytes);
  load.align.addr._0_1_ = 1;
  load._40_8_ = local_70;
  load.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression._0_8_ = type.id;
  wasm::Name::operator=((Name *)&load.ptr,&memoryName);
  (*this->externalInterface->_vptr_ExternalInterface[0xb])
            (__return_storage_ptr__,this->externalInterface,local_e8,type_local.id,
             memoryName.super_IString.str._M_len,memoryName.super_IString.str._M_str);
  Const::~Const((Const *)local_70);
  return __return_storage_ptr__;
}

Assistant:

Literal doAtomicLoad(
    Address addr, Index bytes, Type type, Name memoryName, Address memorySize) {
    checkAtomicAddress(addr, bytes, memorySize);
    Const ptr;
    ptr.value = Literal(int32_t(addr));
    ptr.type = Type::i32;
    Load load;
    load.bytes = bytes;
    // When an atomic loads a partial number of bytes for the type, it is
    // always an unsigned extension.
    load.signed_ = false;
    load.align = bytes;
    load.isAtomic = true; // understatement
    load.ptr = &ptr;
    load.type = type;
    load.memory = memoryName;
    return externalInterface->load(&load, addr, memoryName);
  }